

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_dec.c
# Opt level: O0

int DecodeImageStream(int xsize,int ysize,int is_level0,VP8LDecoder *dec,uint32_t **decoded_data)

{
  uint32_t uVar1;
  int iVar2;
  VP8LDecoder *in_RCX;
  int in_EDX;
  int in_ESI;
  int in_EDI;
  undefined8 *in_R8;
  bool bVar3;
  int unaff_retaddr;
  int unaff_retaddr_00;
  int in_stack_00000008;
  int in_stack_0000000c;
  uint64_t total_size;
  int color_cache_bits;
  uint32_t *data;
  VP8LMetadata *hdr;
  VP8LBitReader *br;
  int transform_ysize;
  int transform_xsize;
  int ok;
  int in_stack_00000058;
  VP8LDecoder *in_stack_00000068;
  VP8LColorCache *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa4;
  byte bVar4;
  undefined1 in_stack_ffffffffffffffa5;
  undefined1 uVar5;
  undefined1 in_stack_ffffffffffffffa6;
  undefined1 in_stack_ffffffffffffffa7;
  VP8LBitReader *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  uint32_t uVar6;
  void *local_48;
  VP8LDecoder *dec_00;
  undefined4 in_stack_ffffffffffffffd0;
  uint uVar7;
  
  uVar7 = 1;
  dec_00 = (VP8LDecoder *)&in_RCX->br_;
  local_48 = (void *)0x0;
  uVar6 = 0;
  if (in_EDX != 0) {
    while( true ) {
      bVar3 = false;
      if (uVar7 != 0) {
        uVar1 = VP8LReadBits(in_stack_ffffffffffffffa8,
                             (uint)CONCAT12(in_stack_ffffffffffffffa6,
                                            CONCAT11(in_stack_ffffffffffffffa5,
                                                     in_stack_ffffffffffffffa4)));
        bVar3 = uVar1 != 0;
      }
      if (!bVar3) break;
      uVar7 = ReadTransform((int *)CONCAT44(uVar7,in_EDI),
                            (int *)CONCAT44(in_ESI,in_stack_ffffffffffffffd0),dec_00);
    }
    in_stack_ffffffffffffffa7 = 0;
  }
  if ((uVar7 != 0) &&
     (uVar1 = VP8LReadBits(in_stack_ffffffffffffffa8,
                           CONCAT13(in_stack_ffffffffffffffa7,
                                    CONCAT12(in_stack_ffffffffffffffa6,
                                             CONCAT11(in_stack_ffffffffffffffa5,
                                                      in_stack_ffffffffffffffa4)))), uVar1 != 0)) {
    uVar6 = VP8LReadBits(in_stack_ffffffffffffffa8,
                         CONCAT13(in_stack_ffffffffffffffa7,
                                  CONCAT12(in_stack_ffffffffffffffa6,
                                           CONCAT11(in_stack_ffffffffffffffa5,
                                                    in_stack_ffffffffffffffa4))));
    in_stack_ffffffffffffffa6 = 0 < (int)uVar6 && (int)uVar6 < 0xc;
    uVar7 = (uint)(byte)in_stack_ffffffffffffffa6;
    if (uVar7 == 0) {
      VP8LSetError(in_RCX,VP8_STATUS_BITSTREAM_ERROR);
      goto LAB_0010e657;
    }
  }
  uVar5 = false;
  if (uVar7 != 0) {
    iVar2 = ReadHuffmanCodes((VP8LDecoder *)total_size,in_stack_0000000c,in_stack_00000008,
                             unaff_retaddr_00,unaff_retaddr);
    uVar5 = iVar2 != 0;
  }
  uVar7 = (uint)(byte)uVar5;
  if (uVar7 == 0) {
    VP8LSetError(in_RCX,VP8_STATUS_BITSTREAM_ERROR);
  }
  else {
    if ((int)uVar6 < 1) {
      (in_RCX->hdr_).color_cache_size_ = 0;
    }
    else {
      (in_RCX->hdr_).color_cache_size_ = 1 << ((byte)uVar6 & 0x1f);
      iVar2 = VP8LColorCacheInit(in_stack_ffffffffffffff98,0);
      if (iVar2 == 0) {
        uVar7 = VP8LSetError(in_RCX,VP8_STATUS_OUT_OF_MEMORY);
        goto LAB_0010e657;
      }
    }
    UpdateDecoder((VP8LDecoder *)CONCAT44(uVar6,in_stack_ffffffffffffffb0),
                  (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20),(int)in_stack_ffffffffffffffa8);
    if (in_EDX == 0) {
      local_48 = WebPSafeMalloc((long)in_EDI * (long)in_ESI,
                                CONCAT17(in_stack_ffffffffffffffa7,
                                         CONCAT16(in_stack_ffffffffffffffa6,
                                                  CONCAT15(uVar5,CONCAT14(in_stack_ffffffffffffffa4,
                                                                          in_stack_ffffffffffffffa0)
                                                          ))));
      if (local_48 == (void *)0x0) {
        uVar7 = VP8LSetError(in_RCX,VP8_STATUS_OUT_OF_MEMORY);
      }
      else {
        iVar2 = DecodeImageData(in_stack_00000068,(uint32_t *)CONCAT44(xsize,ysize),is_level0,
                                in_stack_00000058,dec._4_4_,(ProcessRowsFunc)decoded_data);
        bVar4 = 0;
        if (iVar2 != 0) {
          bVar4 = *(int *)((long)&dec_00->argb_cache_ + 4) != 0 ^ 0xff;
        }
        uVar7 = (uint)(bVar4 & 1);
      }
    }
    else {
      in_RCX->state_ = READ_HDR;
    }
  }
LAB_0010e657:
  if (uVar7 == 0) {
    WebPSafeFree((void *)0x10e668);
    ClearMetadata((VP8LMetadata *)0x10e672);
  }
  else {
    if (in_R8 != (undefined8 *)0x0) {
      *in_R8 = local_48;
    }
    in_RCX->last_pixel_ = 0;
    if (in_EDX == 0) {
      ClearMetadata((VP8LMetadata *)0x10e6ad);
    }
  }
  return uVar7;
}

Assistant:

static int DecodeImageStream(int xsize, int ysize,
                             int is_level0,
                             VP8LDecoder* const dec,
                             uint32_t** const decoded_data) {
  int ok = 1;
  int transform_xsize = xsize;
  int transform_ysize = ysize;
  VP8LBitReader* const br = &dec->br_;
  VP8LMetadata* const hdr = &dec->hdr_;
  uint32_t* data = NULL;
  int color_cache_bits = 0;

  // Read the transforms (may recurse).
  if (is_level0) {
    while (ok && VP8LReadBits(br, 1)) {
      ok = ReadTransform(&transform_xsize, &transform_ysize, dec);
    }
  }

  // Color cache
  if (ok && VP8LReadBits(br, 1)) {
    color_cache_bits = VP8LReadBits(br, 4);
    ok = (color_cache_bits >= 1 && color_cache_bits <= MAX_CACHE_BITS);
    if (!ok) {
      VP8LSetError(dec, VP8_STATUS_BITSTREAM_ERROR);
      goto End;
    }
  }

  // Read the Huffman codes (may recurse).
  ok = ok && ReadHuffmanCodes(dec, transform_xsize, transform_ysize,
                              color_cache_bits, is_level0);
  if (!ok) {
    VP8LSetError(dec, VP8_STATUS_BITSTREAM_ERROR);
    goto End;
  }

  // Finish setting up the color-cache
  if (color_cache_bits > 0) {
    hdr->color_cache_size_ = 1 << color_cache_bits;
    if (!VP8LColorCacheInit(&hdr->color_cache_, color_cache_bits)) {
      ok = VP8LSetError(dec, VP8_STATUS_OUT_OF_MEMORY);
      goto End;
    }
  } else {
    hdr->color_cache_size_ = 0;
  }
  UpdateDecoder(dec, transform_xsize, transform_ysize);

  if (is_level0) {   // level 0 complete
    dec->state_ = READ_HDR;
    goto End;
  }

  {
    const uint64_t total_size = (uint64_t)transform_xsize * transform_ysize;
    data = (uint32_t*)WebPSafeMalloc(total_size, sizeof(*data));
    if (data == NULL) {
      ok = VP8LSetError(dec, VP8_STATUS_OUT_OF_MEMORY);
      goto End;
    }
  }

  // Use the Huffman trees to decode the LZ77 encoded data.
  ok = DecodeImageData(dec, data, transform_xsize, transform_ysize,
                       transform_ysize, NULL);
  ok = ok && !br->eos_;

 End:
  if (!ok) {
    WebPSafeFree(data);
    ClearMetadata(hdr);
  } else {
    if (decoded_data != NULL) {
      *decoded_data = data;
    } else {
      // We allocate image data in this function only for transforms. At level 0
      // (that is: not the transforms), we shouldn't have allocated anything.
      assert(data == NULL);
      assert(is_level0);
    }
    dec->last_pixel_ = 0;  // Reset for future DECODE_DATA_FUNC() calls.
    if (!is_level0) ClearMetadata(hdr);  // Clean up temporary data behind.
  }
  return ok;
}